

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

result_type __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<-13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<-10>,_boost::random::detail::M2<-5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
::operator()(well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
             *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint x;
  uint uVar5;
  uint uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  uint z4;
  uint z3;
  uint z2;
  uint z1;
  uint z0;
  size_t im3;
  size_t im2;
  size_t im1;
  size_t l;
  size_t k;
  size_t j;
  size_t i;
  uint lower_mask;
  uint upper_mask;
  well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
  *this_local;
  
  uVar7 = mod<unsigned_long>(this->index_);
  uVar8 = mod<unsigned_long>(uVar7 + 0x10);
  uVar9 = mod<unsigned_long>(uVar7 + 0xf);
  uVar10 = mod<unsigned_long>(uVar7 + 0xb);
  uVar11 = mod<unsigned_long>(uVar7 + 10);
  uVar12 = mod<unsigned_long>(uVar7 + 7);
  uVar5 = this->state_[uVar8];
  uVar6 = this->state_[uVar9];
  uVar1 = detail::M3<-21>::transform<unsigned_int>(this->state_[uVar7]);
  uVar2 = detail::M3<6>::transform<unsigned_int>(this->state_[uVar10]);
  uVar3 = detail::M0::transform<unsigned_int>(this->state_[uVar11]);
  uVar4 = detail::M3<-13>::transform<unsigned_int>(this->state_[uVar12]);
  x = uVar1 ^ uVar2 ^ uVar3 ^ uVar4;
  uVar5 = detail::M3<13>::transform<unsigned_int>(uVar5 & 0xff800000 | uVar6 & 0x7fffff);
  uVar6 = detail::M2<-10>::transform<unsigned_int>(uVar1 ^ uVar2);
  uVar1 = detail::M2<-5>::transform<unsigned_int>(uVar3 ^ uVar4);
  uVar2 = detail::M3<13>::transform<unsigned_int>(x);
  uVar2 = uVar5 ^ uVar6 ^ uVar1 ^ uVar2;
  this->state_[uVar7] = x;
  this->state_[uVar8] = uVar2;
  this->index_ = uVar8;
  uVar5 = detail::no_tempering::apply<unsigned_int,17ul,17ul>(uVar2,this->state_,uVar11);
  return uVar5;
}

Assistant:

result_type operator()()
    {
        BOOST_CONSTEXPR_OR_CONST UIntType upper_mask = ~0U << p;
        BOOST_CONSTEXPR_OR_CONST UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        const std::size_t i = mod(index_);

        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        const std::size_t j = i + r;
        const std::size_t k = mod(j - 1); // [i,r-1]
        const std::size_t l = mod(j - 2); // [i,r-2]

        const std::size_t im1 = mod(i + m1);
        const std::size_t im2 = mod(i + m2);
        const std::size_t im3 = mod(i + m3);

        UIntType z0;
        UIntType z1;
        UIntType z2;
        UIntType z3;
        UIntType z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state_[im1]);
        z2 = T2::transform(state_[im2]) ^
             T3::transform(state_[im3]);
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<UIntType, r>(z4, state_, im2);
    }